

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O3

void __thiscall
CoinStatsIndex::CoinStatsIndex
          (CoinStatsIndex *this,
          unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> chain,
          size_t n_cache_size,bool f_memory,bool f_wipe)

{
  string name;
  char cVar1;
  DB *this_00;
  pointer __p;
  long in_FS_OFFSET;
  path path;
  undefined8 in_stack_fffffffffffffec8;
  unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *this_01;
  __uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> in_stack_fffffffffffffed0;
  long *plVar2;
  _Alloc_hider in_stack_fffffffffffffee0;
  path local_f8;
  path local_d0;
  path local_a8;
  path local_80;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)chain._M_t.
                     super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                     .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  *(undefined8 *)
   chain._M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t
   .super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
   super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl = 0;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"coinstatsindex","");
  name._M_string_length =
       (size_type)
       in_stack_fffffffffffffed0._M_t.
       super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
       super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
  name.field_2._M_allocated_capacity = (size_type)plVar2;
  name.field_2._8_8_ = in_stack_fffffffffffffee0._M_p;
  BaseIndex::BaseIndex
            (&this->super_BaseIndex,
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)
             &stack0xfffffffffffffed8,name);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  (this->super_BaseIndex).super_CValidationInterface._vptr_CValidationInterface =
       (_func_int **)&PTR_UpdatedBlockTip_00b25d58;
  this_01 = &this->m_db;
  (this->m_db)._M_t.super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
  super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
  super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl = (DB *)0x0;
  MuHash3072::MuHash3072(&this->m_muhash);
  this->m_total_unspendables_scripts = 0;
  this->m_total_unspendables_unclaimed_rewards = 0;
  this->m_total_unspendables_genesis_block = 0;
  this->m_total_unspendables_bip30 = 0;
  this->m_total_new_outputs_ex_coinbase_amount = 0;
  this->m_total_coinbase_amount = 0;
  this->m_total_unspendable_amount = 0;
  this->m_total_prevout_spent_amount = 0;
  this->m_total_amount = 0;
  this->m_total_subsidy = 0;
  this->m_transaction_output_count = 0;
  this->m_bogo_size = 0;
  ArgsManager::GetDataDir((path *)&local_d0,&gArgs,true);
  std::filesystem::__cxx11::path::_M_append(&local_d0,7,"indexes");
  std::filesystem::__cxx11::path::path(&local_a8,&local_d0);
  std::filesystem::__cxx11::path::_M_append(&local_a8,9,"coinstats");
  std::filesystem::__cxx11::path::path(&local_80,&local_a8);
  std::filesystem::__cxx11::path::~path(&local_a8);
  std::filesystem::__cxx11::path::~path(&local_d0);
  cVar1 = std::filesystem::symlink_status((path *)&local_80);
  if (cVar1 == '\x03') {
    cVar1 = std::filesystem::status((path *)&local_80);
    if (cVar1 == '\x02') goto LAB_0048ff4e;
  }
  std::filesystem::create_directories((path *)&local_80);
LAB_0048ff4e:
  std::filesystem::__cxx11::path::path((path *)&stack0xfffffffffffffee0,&local_80);
  std::filesystem::__cxx11::path::_M_append(&stack0xfffffffffffffee0,2,"db");
  std::filesystem::__cxx11::path::path(&local_f8,(path *)&stack0xfffffffffffffee0);
  this_00 = (DB *)operator_new(0x70);
  BaseIndex::DB::DB(this_00,(path *)&local_f8,n_cache_size,f_memory,f_wipe,false);
  std::__uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::reset
            ((__uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)this_01,this_00)
  ;
  std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::~unique_ptr
            ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
             &stack0xfffffffffffffed0);
  std::filesystem::__cxx11::path::~path(&local_f8);
  std::filesystem::__cxx11::path::~path((path *)&stack0xfffffffffffffee0);
  std::filesystem::__cxx11::path::~path(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CoinStatsIndex::CoinStatsIndex(std::unique_ptr<interfaces::Chain> chain, size_t n_cache_size, bool f_memory, bool f_wipe)
    : BaseIndex(std::move(chain), "coinstatsindex")
{
    fs::path path{gArgs.GetDataDirNet() / "indexes" / "coinstats"};
    fs::create_directories(path);

    m_db = std::make_unique<CoinStatsIndex::DB>(path / "db", n_cache_size, f_memory, f_wipe);
}